

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathCompareValues(xmlXPathParserContextPtr ctxt,int inf,int strict)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  xmlXPathObjectType xVar5;
  uint uVar6;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr value_00;
  xmlXPathObjectType xVar7;
  xmlXPathObjectPtr arg;
  double dVar8;
  double dVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  if (ctxt->context == (xmlXPathContextPtr)0x0) {
    return 0;
  }
  value = valuePop(ctxt);
  value_00 = valuePop(ctxt);
  if (value == (xmlXPathObjectPtr)0x0 || value_00 == (xmlXPathObjectPtr)0x0) {
    if (value_00 != (xmlXPathObjectPtr)0x0) {
      value = value_00;
    }
    xmlXPathReleaseObject(ctxt->context,value);
    xmlXPathErr(ctxt,10);
    return 0;
  }
  xVar5 = value->type;
  if ((xVar5 | XPATH_USERS) != XPATH_XSLT_TREE) {
    xVar7 = value_00->type;
    if (xVar7 != XPATH_XSLT_TREE) {
      if (xVar7 != XPATH_NUMBER) {
        if (xVar7 == XPATH_NODESET) goto LAB_001b5540;
        valuePush(ctxt,value_00);
        xmlXPathNumberFunction(ctxt,1);
        value_00 = valuePop(ctxt);
        xVar5 = value->type;
      }
      if (xVar5 != XPATH_NUMBER) {
        valuePush(ctxt,value);
        xmlXPathNumberFunction(ctxt,1);
        value = valuePop(ctxt);
      }
      if ((ctxt->error != 0) || (dVar1 = value_00->floatval, NAN(dVar1))) {
LAB_001b55d4:
        uVar6 = 0;
        goto LAB_001b55d6;
      }
      dVar2 = value->floatval;
      uVar6 = 0;
      if (NAN(dVar2)) goto LAB_001b55d6;
      dVar8 = ABS(dVar1);
      uVar11 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
      if (dVar8 != INFINITY) {
        uVar11 = uVar6;
      }
      dVar9 = ABS(dVar2);
      uVar10 = ((0.0 < dVar2) - 1) + (uint)(0.0 < dVar2);
      if (dVar9 != INFINITY) {
        uVar10 = uVar6;
      }
      if (strict == 0 || inf == 0) {
        if (inf == 0 || strict != 0) {
          if (strict == 0 || inf != 0) {
            if (strict != 0 || inf != 0) goto LAB_001b55d4;
            uVar6 = 1;
            if ((0.0 < dVar1 && dVar8 == INFINITY) || (uVar10 == 0xffffffff)) goto LAB_001b55d6;
            bVar12 = dVar1 < dVar2;
            goto LAB_001b5771;
          }
          uVar6 = 1;
          if ((((0.0 < dVar1) && (uVar10 != 1)) && (dVar8 == INFINITY)) ||
             ((0.0 < dVar1 || dVar8 != INFINITY && (uVar10 == 0xffffffff)))) goto LAB_001b55d6;
          bVar12 = dVar2 < dVar1;
        }
        else {
          uVar6 = 1;
          if ((uVar11 == 0xffffffff) || (0.0 < dVar2 && dVar9 == INFINITY)) goto LAB_001b55d6;
          bVar12 = dVar2 < dVar1;
LAB_001b5771:
          bVar12 = !bVar12;
        }
        bVar3 = dVar8 != INFINITY && dVar9 != INFINITY;
      }
      else {
        uVar6 = 1;
        if (((uVar11 == 0xffffffff) && (0.0 < dVar2 || dVar9 != INFINITY)) ||
           ((uVar11 != 1 && 0.0 < dVar2) && dVar9 == INFINITY)) goto LAB_001b55d6;
        bVar12 = dVar8 != INFINITY;
        bVar3 = dVar1 < dVar2 && dVar9 != INFINITY;
      }
      uVar6 = (uint)(byte)(bVar3 & bVar12);
LAB_001b55d6:
      xmlXPathReleaseObject(ctxt->context,value_00);
      xmlXPathReleaseObject(ctxt->context,value);
      return uVar6;
    }
LAB_001b5540:
    if (xVar5 != XPATH_NODESET) goto LAB_001b5545;
  }
  xVar7 = value_00->type;
  if ((xVar7 | XPATH_USERS) == XPATH_XSLT_TREE) {
    iVar4 = xmlXPathCompareNodeSets(ctxt,inf,strict,value_00,value);
    return iVar4;
  }
LAB_001b5545:
  arg = value_00;
  if ((xVar7 | XPATH_USERS) != XPATH_XSLT_TREE) {
    inf = (int)(inf == 0);
    arg = value;
    value = value_00;
  }
  iVar4 = xmlXPathCompareNodeSetValue(ctxt,inf,strict,arg,value);
  return iVar4;
}

Assistant:

int
xmlXPathCompareValues(xmlXPathParserContextPtr ctxt, int inf, int strict) {
    int ret = 0, arg1i = 0, arg2i = 0;
    xmlXPathObjectPtr arg1, arg2;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = valuePop(ctxt);
    arg1 = valuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 * If either argument is a XPATH_NODESET or XPATH_XSLT_TREE the two arguments
	 * are not freed from within this routine; they will be freed from the
	 * called routine, e.g. xmlXPathCompareNodeSets or xmlXPathCompareNodeSetValue
	 */
	if (((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE)) &&
	  ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE))){
	    ret = xmlXPathCompareNodeSets(ctxt, inf, strict, arg1, arg2);
	} else {
	    if ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
		ret = xmlXPathCompareNodeSetValue(ctxt, inf, strict,
			                          arg1, arg2);
	    } else {
		ret = xmlXPathCompareNodeSetValue(ctxt, !inf, strict,
			                          arg2, arg1);
	    }
	}
	return(ret);
    }

    if (arg1->type != XPATH_NUMBER) {
	valuePush(ctxt, arg1);
	xmlXPathNumberFunction(ctxt, 1);
	arg1 = valuePop(ctxt);
    }
    if (arg2->type != XPATH_NUMBER) {
	valuePush(ctxt, arg2);
	xmlXPathNumberFunction(ctxt, 1);
	arg2 = valuePop(ctxt);
    }
    if (ctxt->error)
        goto error;
    /*
     * Add tests for infinity and nan
     * => feedback on 3.4 for Inf and NaN
     */
    /* Hand check NaN and Infinity comparisons */
    if (xmlXPathIsNaN(arg1->floatval) || xmlXPathIsNaN(arg2->floatval)) {
	ret=0;
    } else {
	arg1i=xmlXPathIsInf(arg1->floatval);
	arg2i=xmlXPathIsInf(arg2->floatval);
	if (inf && strict) {
	    if ((arg1i == -1 && arg2i != -1) ||
		(arg2i == 1 && arg1i != 1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval < arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (inf && !strict) {
	    if (arg1i == -1 || arg2i == 1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval <= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && strict) {
	    if ((arg1i == 1 && arg2i != 1) ||
		(arg2i == -1 && arg1i != -1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval > arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && !strict) {
	    if (arg1i == 1 || arg2i == -1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval >= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
    }
error:
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}